

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O0

WJTL_STATUS TestUnmarshallListAlreadyHasContentsStrFixedArray(void)

{
  JL_STATUS JVar1;
  int iVar2;
  bool bVar3;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  TheStruct theStruct;
  JlMarshallElement marshalTheStruct [1];
  size_t errorAtPos;
  WJTL_STATUS TestReturn;
  
  errorAtPos._4_4_ = WJTL_STATUS_SUCCESS;
  marshalTheStruct[0].ChildStructDescriptionCount = 0;
  marshalTheStruct[0]._92_4_ = 0;
  memcpy(&theStruct.StrFixListCount,&DAT_0014f590,0x60);
  memset(&_result_7,0,0x28);
  JVar1 = JlJsonToStruct("{\"Strs\":[\"aaa\",\"bbb\"]}",
                         (JlMarshallElement *)&theStruct.StrFixListCount,1,&_result_7,
                         (size_t *)&marshalTheStruct[0].ChildStructDescriptionCount);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\\\"Strs\\\":[\\\"aaa\\\",\\\"bbb\\\"]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5a9);
  if (JVar1 != JL_STATUS_SUCCESS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = marshalTheStruct[0]._88_8_ == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5aa);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct.StrFixList[3] == (char *)0x2;
  WjTestLib_Assert(bVar3,"2 == theStruct.StrFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5ab);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar2 = strcmp(__result_7,"aaa");
  WjTestLib_Assert(iVar2 == 0,"strcmp( theStruct.StrFixList[0], \"aaa\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5ac);
  if (iVar2 != 0) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar2 = strcmp(theStruct.StrFixList[0],"bbb");
  WjTestLib_Assert(iVar2 == 0,"strcmp( theStruct.StrFixList[1], \"bbb\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5ad);
  if (iVar2 != 0) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlJsonToStruct("{\"Strs\":[\"ccc\"]}",(JlMarshallElement *)&theStruct.StrFixListCount,1,
                         &_result_7,(size_t *)&marshalTheStruct[0].ChildStructDescriptionCount);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\\\"Strs\\\":[\\\"ccc\\\"]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5b0);
  if (JVar1 != JL_STATUS_SUCCESS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = marshalTheStruct[0]._88_8_ == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5b1);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct.StrFixList[3] == (char *)0x1,"1 == theStruct.StrFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5b2);
  if (theStruct.StrFixList[3] != (char *)0x1) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar2 = strcmp(__result_7,"ccc");
  WjTestLib_Assert(iVar2 == 0,"strcmp( theStruct.StrFixList[0], \"ccc\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5b3);
  if (iVar2 != 0) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlUnmarshallFreeStructAllocs((JlMarshallElement *)&theStruct.StrFixListCount,1,&_result_7)
  ;
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5b6);
  if (JVar1 != JL_STATUS_SUCCESS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  return errorAtPos._4_4_;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallListAlreadyHasContentsStrFixedArray
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    size_t errorAtPos = 0;

    typedef struct
    {
        char*       StrFixList [4];
        size_t      StrFixListCount;
    } TheStruct;

    JlMarshallElement marshalTheStruct[] = {
        JlMarshallStringFixedArray( TheStruct, StrFixList, StrFixListCount, "Strs" )
    };

    TheStruct theStruct = {{0}};

    // Fill in struct with values
    JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"Strs\":[\"aaa\",\"bbb\"]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 2 == theStruct.StrFixListCount );
    JL_ASSERT( strcmp( theStruct.StrFixList[0], "aaa" ) == 0 );
    JL_ASSERT( strcmp( theStruct.StrFixList[1], "bbb" ) == 0 );

    // Now unmarshall again when struct already has a list with contents.
    JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"Strs\":[\"ccc\"]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 1 == theStruct.StrFixListCount );
    JL_ASSERT( strcmp( theStruct.StrFixList[0], "ccc" ) == 0 );

    // Free and make sure no memory leak
    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTheStruct, NumElements(marshalTheStruct), &theStruct ) );

    return TestReturn;
}